

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

void __thiscall
CCoinsViewCache::EmplaceCoinInternalDANGER(CCoinsViewCache *this,COutPoint *outpoint,Coin *coin)

{
  size_t sVar1;
  type_conflict3 *ptVar2;
  pointer ppVar3;
  CoinsCachePair *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar4;
  type_conflict3 *inserted;
  type *it;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  *in_stack_ffffffffffffff78;
  CoinsCachePair *sentinel;
  uint32_t *__args_1;
  uint8_t flags;
  CCoinsCacheEntry *this_00;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *this_01;
  undefined1 local_28 [16];
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> local_18;
  undefined1 local_10;
  size_type local_8;
  
  local_8 = *(size_type *)(in_FS_OFFSET + 0x28);
  sVar1 = Coin::DynamicMemoryUsage((Coin *)in_stack_ffffffffffffff78);
  *(size_t *)in_RDI[4].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       *(long *)in_RDI[4].first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + sVar1;
  __args_1 = &in_RDI[3].first.n;
  this_00 = (CCoinsCacheEntry *)(local_28 + 8);
  std::forward_as_tuple<COutPoint>(&in_RDI->first);
  this_01 = (unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
             *)local_28;
  std::forward_as_tuple<Coin>((Coin *)in_RDI);
  pVar4 = std::
          unordered_map<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>>
          ::emplace<std::piecewise_construct_t_const&,std::tuple<COutPoint&&>,std::tuple<Coin&&>>
                    (this_01,(piecewise_construct_t *)this_00,(tuple<COutPoint_&&> *)__args_1,
                     (tuple<Coin_&&> *)in_RDI);
  flags = (uint8_t)((ulong)__args_1 >> 0x38);
  local_18._M_cur =
       (__node_type *)
       pVar4.first.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
       _M_cur;
  local_10 = pVar4.second;
  std::
  get<0ul,std::__detail::_Node_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>,false,false>,bool>
            (in_stack_ffffffffffffff78);
  ptVar2 = std::
           get<1ul,std::__detail::_Node_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>,false,false>,bool>
                     (in_stack_ffffffffffffff78);
  if ((*ptVar2 & 1U) != 0) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::operator->
                       (&in_stack_ffffffffffffff78->first);
    sentinel = (CoinsCachePair *)&ppVar3->second;
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)sentinel
             );
    CCoinsCacheEntry::AddFlags(this_00,flags,in_RDI,sentinel);
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewCache::EmplaceCoinInternalDANGER(COutPoint&& outpoint, Coin&& coin) {
    cachedCoinsUsage += coin.DynamicMemoryUsage();
    auto [it, inserted] = cacheCoins.emplace(
        std::piecewise_construct,
        std::forward_as_tuple(std::move(outpoint)),
        std::forward_as_tuple(std::move(coin)));
    if (inserted) {
        it->second.AddFlags(CCoinsCacheEntry::DIRTY, *it, m_sentinel);
    }
}